

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

bool __thiscall
soul::heart::Parser::parseTerminator
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  Type *requiredType;
  bool bVar1;
  Block *pBVar2;
  Expression *pEVar3;
  Block *falseBranch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> destArgs;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> falseBranchArgs;
  undefined1 local_e8 [56];
  pool_ptr<soul::heart::Block> local_b0;
  pool_ptr<soul::heart::Block> local_a8;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> local_a0;
  CompileMessage local_68;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"branch");
  if (bVar1) {
    pBVar2 = parseBlockNameAndFind(this,state);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8,this
               ,state);
    expectSemicolon(this);
    local_a8.object = (Block *)0x0;
    FunctionBuilder::addBranch(builder,pBVar2,(ArgListType *)local_e8,&local_a8);
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"branch_if");
    if (!bVar1) {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"return");
      if (!bVar1) {
        return false;
      }
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x2a19e8);
      requiredType = &state->function->returnType;
      if (bVar1) {
        if ((requiredType->category != invalid) &&
           ((state->function->returnType).primitiveType.type != void_)) {
          getTypeDescription_abi_cxx11_((string *)local_e8,this,requiredType);
          Errors::expectedExpressionOfType<std::__cxx11::string>(&local_68,(Errors *)local_e8,args);
          CodeLocation::throwError
                    (&(this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).location,&local_68);
        }
        FunctionBuilder::addReturn(builder);
        return true;
      }
      pEVar3 = parseExpression(this,state,requiredType);
      expectSemicolon(this);
      FunctionBuilder::addReturn(builder,pEVar3);
      return true;
    }
    local_e8._0_8_ = (pool_ref<soul::heart::Expression> *)0x900000001;
    local_e8._8_8_ = 0;
    local_e8._16_8_ = (Structure *)0x0;
    pEVar3 = parseExpression(this,state,(Type *)local_e8);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)(local_e8 + 0x10));
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a1a14);
    pBVar2 = parseBlockNameAndFind(this,state);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8,this
               ,state);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2cadd0);
    falseBranch = parseBlockNameAndFind(this,state);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              (&local_a0,this,state);
    expectSemicolon(this);
    local_b0.object = (Block *)0x0;
    FunctionBuilder::addBranchIf
              (builder,pEVar3,pBVar2,(ArgListType *)local_e8,falseBranch,&local_a0,&local_b0);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::clear(&local_a0);
  }
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::clear
            ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8);
  return true;
}

Assistant:

bool parseTerminator (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("branch"))
        {
            auto& dest = parseBlockNameAndFind (state);
            auto destArgs = parseOptionalBranchArgs<heart::Branch::ArgListType> (state);
            expectSemicolon();
            builder.addBranch (dest, std::move (destArgs), {});
            return true;
        }

        if (matchIf ("branch_if"))
        {
            auto& condition = parseExpression (state, PrimitiveType::bool_);
            expect (HEARTOperator::question);
            auto& trueBranch = parseBlockNameAndFind (state);
            auto trueBranchArgs = parseOptionalBranchArgs<heart::BranchIf::ArgListType> (state);
            expect (HEARTOperator::colon);
            auto& falseBranch = parseBlockNameAndFind (state);
            auto falseBranchArgs = parseOptionalBranchArgs<heart::BranchIf::ArgListType> (state);
            expectSemicolon();
            builder.addBranchIf (condition, trueBranch, std::move (trueBranchArgs), falseBranch, std::move (falseBranchArgs), {});
            return true;
        }

        if (matchIf ("return"))
        {
            if (matchIf (HEARTOperator::semicolon))
            {
                if (state.function.returnType.isValid() && (! state.function.returnType.isVoid()))
                    location.throwError (Errors::expectedExpressionOfType (getTypeDescription (state.function.returnType)));

                builder.addReturn();
                return true;
            }

            auto& value = parseExpression (state, state.function.returnType);
            expectSemicolon();
            builder.addReturn (value);
            return true;
        }

        return false;
    }